

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O2

void set_col_as_taken<InputData<double,unsigned_long>>
               (vector<bool,_std::allocator<bool>_> *col_is_taken,
               robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               *col_is_taken_s,InputData<double,_unsigned_long> *input_data,size_t col_num,
               ColType col_type)

{
  size_t sVar1;
  reference rVar2;
  size_type local_8;
  
  if (col_type == Numeric) {
    sVar1 = 0;
  }
  else {
    sVar1 = input_data->ncols_numeric;
  }
  local_8 = sVar1 + col_num;
  if (((col_is_taken->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p ==
       (col_is_taken->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p) &&
     ((col_is_taken->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset == 0)) {
    tsl::detail_robin_hash::
    robin_hash<unsigned_long,tsl::robin_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,void,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>,false,tsl::rh::power_of_two_growth_policy<2ul>>
    ::insert<unsigned_long_const&>(&col_is_taken_s->m_ht,&local_8);
  }
  else {
    rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](col_is_taken,local_8);
    *rVar2._M_p = *rVar2._M_p | rVar2._M_mask;
  }
  return;
}

Assistant:

void set_col_as_taken(std::vector<bool> &col_is_taken, hashed_set<size_t> &col_is_taken_s,
                      InputData &input_data, size_t col_num, ColType col_type)
{
    col_num += ((col_type == Numeric)? 0 : input_data.ncols_numeric);
    if (!col_is_taken.empty())
        col_is_taken[col_num] = true;
    else
        col_is_taken_s.insert(col_num);
}